

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_false> *tray,RayQueryContext *context)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  char cVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai_1;
  vint4 ai;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 ai_2;
  undefined1 auVar44 [16];
  vint4 ai_5;
  undefined1 auVar45 [16];
  vint4 ai_4;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  puVar15 = local_7d0;
  local_7d8 = root.ptr;
  uVar1 = *(uint *)((long)&(tray->org).field_0 + k * 4);
  uVar10 = *(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar39._4_4_ = uVar10;
  auVar39._0_4_ = uVar10;
  auVar39._8_4_ = uVar10;
  auVar39._12_4_ = uVar10;
  uVar2 = *(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar41._4_4_ = uVar2;
  auVar41._0_4_ = uVar2;
  auVar41._8_4_ = uVar2;
  auVar41._12_4_ = uVar2;
  uVar3 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  auVar21 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar22 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar23 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar24 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar25 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar26._0_8_ = CONCAT44(uVar1,uVar1) ^ 0x8000000080000000;
  auVar26._8_4_ = uVar1 ^ 0x80000000;
  auVar26._12_4_ = uVar1 ^ 0x80000000;
  auVar26 = vmulps_avx512vl(auVar21,auVar26);
  auVar27._0_8_ = CONCAT44(uVar10,uVar10) ^ 0x8000000080000000;
  auVar27._8_4_ = uVar10 ^ 0x80000000;
  auVar27._12_4_ = uVar10 ^ 0x80000000;
  auVar27 = vmulps_avx512vl(auVar22,auVar27);
  auVar28._0_8_ = CONCAT44(uVar2,uVar2) ^ 0x8000000080000000;
  auVar28._8_4_ = uVar2 ^ 0x80000000;
  auVar28._12_4_ = uVar2 ^ 0x80000000;
  auVar28 = vmulps_avx512vl(auVar23,auVar28);
LAB_006e689f:
  bVar6 = puVar15 != &local_7d8;
  if (puVar15 == &local_7d8) {
    return bVar6;
  }
  uVar12 = puVar15[-1];
  puVar15 = puVar15 + -1;
LAB_006e68b3:
  if ((uVar12 & 0xf) == 0) {
    auVar29 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar18),auVar26,auVar21);
    auVar30 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar14),auVar27,auVar22);
    auVar29 = vpmaxsd_avx(auVar29,auVar30);
    auVar31 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(uVar12 + 0x20 + uVar17),auVar28,auVar23);
    auVar30 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar18 ^ 0x10)),auVar26,auVar21);
    auVar32 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar14 ^ 0x10)),auVar27,auVar22);
    auVar30 = vpminsd_avx(auVar30,auVar32);
    auVar32 = vfmadd132ps_avx512vl
                        (*(undefined1 (*) [16])(uVar12 + 0x20 + (uVar17 ^ 0x10)),auVar28,auVar23);
    auVar31 = vpmaxsd_avx512vl(auVar31,auVar24);
    auVar29 = vpmaxsd_avx(auVar29,auVar31);
    auVar31 = vpminsd_avx512vl(auVar32,auVar25);
    auVar30 = vpminsd_avx(auVar30,auVar31);
    uVar7 = vpcmpd_avx512vl(auVar29,auVar30,2);
    bVar20 = (byte)uVar7 & 0xf;
  }
  else {
    if ((int)(uVar12 & 0xf) != 2) {
      cVar9 = (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(uVar12 & 0xfffffffffffffff0) * 0x40 + 0x18))
                        (pre,ray,k,context);
      if (cVar9 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        return bVar6;
      }
      goto LAB_006e689f;
    }
    uVar11 = uVar12 & 0xfffffffffffffff0;
    auVar29 = *(undefined1 (*) [16])(uVar11 + 0x80);
    auVar32._0_4_ = fVar5 * auVar29._0_4_;
    auVar32._4_4_ = fVar5 * auVar29._4_4_;
    auVar32._8_4_ = fVar5 * auVar29._8_4_;
    auVar32._12_4_ = fVar5 * auVar29._12_4_;
    auVar30 = *(undefined1 (*) [16])(uVar11 + 0x90);
    auVar31 = *(undefined1 (*) [16])(uVar11 + 0xa0);
    auVar36._0_4_ = fVar5 * auVar30._0_4_;
    auVar36._4_4_ = fVar5 * auVar30._4_4_;
    auVar36._8_4_ = fVar5 * auVar30._8_4_;
    auVar36._12_4_ = fVar5 * auVar30._12_4_;
    auVar42._0_4_ = fVar5 * auVar31._0_4_;
    auVar42._4_4_ = fVar5 * auVar31._4_4_;
    auVar42._8_4_ = fVar5 * auVar31._8_4_;
    auVar42._12_4_ = fVar5 * auVar31._12_4_;
    auVar37._4_4_ = uVar4;
    auVar37._0_4_ = uVar4;
    auVar37._8_4_ = uVar4;
    auVar37._12_4_ = uVar4;
    auVar32 = vfmadd231ps_fma(auVar32,auVar37,*(undefined1 (*) [16])(uVar11 + 0x50));
    auVar36 = vfmadd231ps_fma(auVar36,auVar37,*(undefined1 (*) [16])(uVar11 + 0x60));
    auVar37 = vfmadd231ps_fma(auVar42,auVar37,*(undefined1 (*) [16])(uVar11 + 0x70));
    auVar8._4_4_ = uVar3;
    auVar8._0_4_ = uVar3;
    auVar8._8_4_ = uVar3;
    auVar8._12_4_ = uVar3;
    auVar38 = vfmadd231ps_fma(auVar32,auVar8,*(undefined1 (*) [16])(uVar11 + 0x20));
    auVar36 = vfmadd231ps_fma(auVar36,auVar8,*(undefined1 (*) [16])(uVar11 + 0x30));
    auVar37 = vfmadd231ps_fma(auVar37,auVar8,*(undefined1 (*) [16])(uVar11 + 0x40));
    auVar47._8_4_ = 0x7fffffff;
    auVar47._0_8_ = 0x7fffffff7fffffff;
    auVar47._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar47,auVar38);
    auVar49._8_4_ = 0x219392ef;
    auVar49._0_8_ = 0x219392ef219392ef;
    auVar49._12_4_ = 0x219392ef;
    uVar16 = vcmpps_avx512vl(auVar32,auVar49,1);
    bVar19 = (bool)((byte)uVar16 & 1);
    auVar33._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._0_4_;
    bVar19 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar33._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._4_4_;
    bVar19 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar33._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._8_4_;
    bVar19 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar33._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar38._12_4_;
    auVar32 = vandps_avx(auVar47,auVar36);
    uVar16 = vcmpps_avx512vl(auVar32,auVar49,1);
    bVar19 = (bool)((byte)uVar16 & 1);
    auVar34._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar36._0_4_;
    bVar19 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar36._4_4_;
    bVar19 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar36._8_4_;
    bVar19 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar36._12_4_;
    auVar32 = vandps_avx(auVar47,auVar37);
    uVar16 = vcmpps_avx512vl(auVar32,auVar49,1);
    bVar19 = (bool)((byte)uVar16 & 1);
    auVar35._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar37._0_4_;
    bVar19 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar35._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar37._4_4_;
    bVar19 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar35._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar37._8_4_;
    bVar19 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar35._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar37._12_4_;
    auVar36 = vrcp14ps_avx512vl(auVar33);
    auVar48._8_4_ = 0x3f800000;
    auVar48._0_8_ = 0x3f8000003f800000;
    auVar48._12_4_ = 0x3f800000;
    auVar32 = vfnmadd213ps_fma(auVar33,auVar36,auVar48);
    auVar32 = vfmadd132ps_fma(auVar32,auVar36,auVar36);
    auVar37 = vrcp14ps_avx512vl(auVar34);
    auVar36 = vfnmadd213ps_fma(auVar34,auVar37,auVar48);
    auVar36 = vfmadd132ps_fma(auVar36,auVar37,auVar37);
    auVar38 = vrcp14ps_avx512vl(auVar35);
    auVar37 = vfnmadd213ps_fma(auVar35,auVar38,auVar48);
    auVar37 = vfmadd132ps_fma(auVar37,auVar38,auVar38);
    auVar29 = vfmadd213ps_fma(auVar29,auVar41,*(undefined1 (*) [16])(uVar11 + 0xb0));
    auVar30 = vfmadd213ps_fma(auVar30,auVar41,*(undefined1 (*) [16])(uVar11 + 0xc0));
    auVar31 = vfmadd213ps_fma(auVar31,auVar41,*(undefined1 (*) [16])(uVar11 + 0xd0));
    auVar29 = vfmadd231ps_fma(auVar29,auVar39,*(undefined1 (*) [16])(uVar11 + 0x50));
    auVar30 = vfmadd231ps_fma(auVar30,auVar39,*(undefined1 (*) [16])(uVar11 + 0x60));
    auVar31 = vfmadd231ps_fma(auVar31,auVar39,*(undefined1 (*) [16])(uVar11 + 0x70));
    auVar38._4_4_ = uVar1;
    auVar38._0_4_ = uVar1;
    auVar38._8_4_ = uVar1;
    auVar38._12_4_ = uVar1;
    auVar29 = vfmadd231ps_fma(auVar29,auVar38,*(undefined1 (*) [16])(uVar11 + 0x20));
    auVar46._0_4_ = -auVar32._0_4_ * auVar29._0_4_;
    auVar46._4_4_ = -auVar32._4_4_ * auVar29._4_4_;
    auVar46._8_4_ = -auVar32._8_4_ * auVar29._8_4_;
    auVar46._12_4_ = -auVar32._12_4_ * auVar29._12_4_;
    auVar29 = vfmadd231ps_fma(auVar30,auVar38,*(undefined1 (*) [16])(uVar11 + 0x30));
    auVar45._0_4_ = -auVar36._0_4_ * auVar29._0_4_;
    auVar45._4_4_ = -auVar36._4_4_ * auVar29._4_4_;
    auVar45._8_4_ = -auVar36._8_4_ * auVar29._8_4_;
    auVar45._12_4_ = -auVar36._12_4_ * auVar29._12_4_;
    auVar29 = vfmadd231ps_fma(auVar31,auVar38,*(undefined1 (*) [16])(uVar11 + 0x40));
    auVar44._0_4_ = -auVar37._0_4_ * auVar29._0_4_;
    auVar44._4_4_ = -auVar37._4_4_ * auVar29._4_4_;
    auVar44._8_4_ = -auVar37._8_4_ * auVar29._8_4_;
    auVar44._12_4_ = -auVar37._12_4_ * auVar29._12_4_;
    auVar31._0_4_ = auVar32._0_4_ + auVar46._0_4_;
    auVar31._4_4_ = auVar32._4_4_ + auVar46._4_4_;
    auVar31._8_4_ = auVar32._8_4_ + auVar46._8_4_;
    auVar31._12_4_ = auVar32._12_4_ + auVar46._12_4_;
    auVar40._0_4_ = auVar36._0_4_ + auVar45._0_4_;
    auVar40._4_4_ = auVar36._4_4_ + auVar45._4_4_;
    auVar40._8_4_ = auVar36._8_4_ + auVar45._8_4_;
    auVar40._12_4_ = auVar36._12_4_ + auVar45._12_4_;
    auVar43._0_4_ = auVar37._0_4_ + auVar44._0_4_;
    auVar43._4_4_ = auVar37._4_4_ + auVar44._4_4_;
    auVar43._8_4_ = auVar37._8_4_ + auVar44._8_4_;
    auVar43._12_4_ = auVar37._12_4_ + auVar44._12_4_;
    auVar36 = vpminsd_avx(auVar46,auVar31);
    auVar29 = vpminsd_avx(auVar45,auVar40);
    auVar30 = vpminsd_avx(auVar44,auVar43);
    auVar29 = vmaxps_avx(auVar29,auVar30);
    auVar31 = vpmaxsd_avx(auVar46,auVar31);
    auVar30 = vpmaxsd_avx(auVar45,auVar40);
    auVar32 = vpmaxsd_avx(auVar44,auVar43);
    auVar30 = vminps_avx(auVar30,auVar32);
    auVar32 = vmaxps_avx512vl(auVar24,auVar36);
    auVar29 = vmaxps_avx(auVar32,auVar29);
    auVar31 = vminps_avx512vl(auVar25,auVar31);
    auVar30 = vminps_avx(auVar31,auVar30);
    uVar7 = vcmpps_avx512vl(auVar29,auVar30,2);
    bVar20 = (byte)uVar7;
  }
  bVar20 = bVar20 & 0xf;
  if (bVar20 == 0) goto LAB_006e689f;
  uVar16 = uVar12 & 0xfffffffffffffff0;
  lVar13 = 0;
  for (uVar12 = (ulong)bVar20; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
    lVar13 = lVar13 + 1;
  }
  uVar12 = *(ulong *)(uVar16 + lVar13 * 8);
  uVar10 = bVar20 - 1 & (uint)bVar20;
  uVar11 = (ulong)uVar10;
  if (uVar10 != 0) {
    *puVar15 = uVar12;
    lVar13 = 0;
    for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
      lVar13 = lVar13 + 1;
    }
    uVar10 = uVar10 - 1 & uVar10;
    uVar11 = (ulong)uVar10;
    bVar19 = uVar10 == 0;
    while( true ) {
      puVar15 = puVar15 + 1;
      uVar12 = *(ulong *)(uVar16 + lVar13 * 8);
      if (bVar19) break;
      *puVar15 = uVar12;
      lVar13 = 0;
      for (uVar12 = uVar11; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        lVar13 = lVar13 + 1;
      }
      uVar11 = uVar11 - 1 & uVar11;
      bVar19 = uVar11 == 0;
    }
  }
  goto LAB_006e68b3;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }